

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O1

void __thiscall Centaurus::Context<char>::parse(Context<char> *this,char *input_path,int worker_num)

{
  int bank_num;
  iterator iVar1;
  iterator iVar2;
  __pid_t master_pid;
  Stage1Runner *pSVar3;
  BaseRunner **ppBVar4;
  BaseRunner **ppBVar5;
  vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> runners;
  ParseContext<char> context;
  BaseRunner **local_68;
  iterator iStack_60;
  BaseRunner **local_58;
  Stage1Runner *local_48;
  vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  *local_40;
  void *local_38;
  
  master_pid = getpid();
  local_40 = &this->m_callbacks;
  local_38 = (void *)0x0;
  local_58 = (BaseRunner **)0x0;
  local_68 = (BaseRunner **)0x0;
  iStack_60._M_current = (BaseRunner **)0x0;
  pSVar3 = (Stage1Runner *)operator_new(0x280);
  bank_num = worker_num * 2;
  Stage1Runner::Stage1Runner
            (pSVar3,input_path,&(this->m_parser).super_IParser,0x800000,bank_num,false,false);
  local_48 = pSVar3;
  if (iStack_60._M_current == local_58) {
    std::vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>>::
    _M_realloc_insert<Centaurus::BaseRunner*>
              ((vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>> *)&local_68,
               iStack_60,(BaseRunner **)&local_48);
  }
  else {
    *iStack_60._M_current = (BaseRunner *)pSVar3;
    iStack_60._M_current = iStack_60._M_current + 1;
  }
  if (0 < worker_num) {
    do {
      pSVar3 = (Stage1Runner *)operator_new(0x270);
      Stage2Runner::Stage2Runner
                ((Stage2Runner *)pSVar3,input_path,0x800000,bank_num,master_pid,&local_40,
                 (atomic<int> *)0x0);
      pSVar3->m_parser = (IParser *)callback;
      pSVar3->m_current_bank = 0;
      pSVar3->m_counter = 0;
      local_48 = pSVar3;
      if (iStack_60._M_current == local_58) {
        std::vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>>::
        _M_realloc_insert<Centaurus::BaseRunner*>
                  ((vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>> *)
                   &local_68,iStack_60,(BaseRunner **)&local_48);
      }
      else {
        *iStack_60._M_current = (BaseRunner *)pSVar3;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      worker_num = worker_num + -1;
    } while (worker_num != 0);
  }
  pSVar3 = (Stage1Runner *)operator_new(0x280);
  Stage3Runner::Stage3Runner
            ((Stage3Runner *)pSVar3,input_path,0x800000,bank_num,master_pid,&local_40,
             (atomic<int> *)0x0);
  pSVar3->m_parser = (IParser *)callback;
  *(TransferListener *)&pSVar3->m_current_bank = (TransferListener)0x0;
  local_48 = pSVar3;
  if (iStack_60._M_current == local_58) {
    std::vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>>::
    _M_realloc_insert<Centaurus::BaseRunner*>
              ((vector<Centaurus::BaseRunner*,std::allocator<Centaurus::BaseRunner*>> *)&local_68,
               iStack_60,(BaseRunner **)&local_48);
  }
  else {
    *iStack_60._M_current = (BaseRunner *)pSVar3;
    iStack_60._M_current = iStack_60._M_current + 1;
  }
  iVar1._M_current = iStack_60._M_current;
  local_38 = (((NonRecursiveReductionRunner *)&pSVar3->super_BaseRunner)->super_BaseRunner).
             m_input_window;
  for (ppBVar5 = local_68; iVar2._M_current = iStack_60._M_current, ppBVar4 = local_68,
      ppBVar5 != iVar1._M_current; ppBVar5 = ppBVar5 + 1) {
    (*((*ppBVar5)->super_BaseListener)._vptr_BaseListener[5])();
  }
  for (; iVar1._M_current = iStack_60._M_current, ppBVar5 = local_68, ppBVar4 != iVar2._M_current;
      ppBVar4 = ppBVar4 + 1) {
    (*((*ppBVar4)->super_BaseListener)._vptr_BaseListener[6])();
  }
  for (; ppBVar5 != iVar1._M_current; ppBVar5 = ppBVar5 + 1) {
    if (*ppBVar5 != (BaseRunner *)0x0) {
      (*((*ppBVar5)->super_BaseListener)._vptr_BaseListener[1])();
    }
  }
  if (local_68 != (BaseRunner **)0x0) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void parse(const char *input_path, int worker_num)
    {
        int pid = get_current_pid();

        ParseContext<TCHAR> context{m_callbacks, nullptr};

        std::vector<BaseRunner *> runners;
        runners.push_back(new Stage1Runner{ input_path, &m_parser, 8 * 1024 * 1024, worker_num * 2 });
        for (int i = 0; i < worker_num; i++)
        {
            Stage2Runner *st2 = new Stage2Runner{input_path, 8 * 1024 * 1024, worker_num * 2, pid, static_cast<void *>(&context) };

            st2->register_listener(callback);

            runners.push_back(st2);
        }
        Stage3Runner *st3 = new Stage3Runner{ input_path, 8 * 1024 * 1024, worker_num * 2, pid, static_cast<void *>(&context) };

        st3->register_listener(callback);

        runners.push_back(st3);

        context.m_window = st3->get_input();

        for (auto p : runners)
        {
            p->start();
        }
        for (auto p : runners)
        {
            p->wait();
        }
        for (auto p : runners)
        {
            delete p;
        }
    }